

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Stress::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DrawTest *pDVar1;
  IndexType type;
  IndexType type_00;
  Storage storage;
  long lVar2;
  int *value;
  allocator<char> local_181;
  TestNode *local_180;
  string iterationDesc;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  IndexTest tests [1];
  string local_c0;
  string name;
  DrawTestSpec local_80;
  
  tests[0]._0_8_ = &DAT_100000001;
  tests[0].aligned = false;
  tests[0]._9_3_ = 0;
  tests[0].offsets[0] = 1;
  tests[0].offsets[1] = 3;
  tests[0].offsets[2] = -1;
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_80);
  local_180 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_180,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_buffer","unaligned buffer");
  local_80.drawMethod = this->m_method;
  local_80.apiType.m_bits = 2;
  local_80.primitive = PRIMITIVE_TRIANGLES;
  local_80.primitiveCount = 5;
  local_80.indexType = INDEXTYPE_LAST;
  local_80.indexPointerOffset = 0;
  local_80.indexStorage = STORAGE_LAST;
  local_80.first = 0;
  local_80.indexMin = 0;
  local_80.indexMax = 0;
  local_80.instanceCount = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&local_80.attribs,2);
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->inputType = INPUTTYPE_FLOAT;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &(local_80.attribs.
     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
     ._M_impl.super__Vector_impl_data._M_start)->storage = &DAT_100000001;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->componentCount = 4;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute = false;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (local_80.attribs.
   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalize = false;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].inputType = INPUTTYPE_FLOAT;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].outputType = OUTPUTTYPE_VEC2;
  *(undefined1 **)
   &local_80.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_start[1].storage = &DAT_100000001;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].componentCount = 2;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].instanceDivisor = 0;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].useDefaultAttribute = false;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalize = false;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  local_80.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  tcu::TestNode::addChild((TestNode *)this,local_180);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&desc,"index_",(allocator<char> *)&local_118);
  deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
            (&iterationDesc,(DrawTestSpec *)&DAT_00000001,type);
  std::operator+(&name,&desc,&iterationDesc);
  std::__cxx11::string::~string((string *)&iterationDesc);
  std::__cxx11::string::~string((string *)&desc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"index ",&local_181);
  deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
            ((string *)&test,(DrawTestSpec *)&DAT_00000001,type_00);
  std::operator+(&local_118,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&test);
  std::operator+(&iterationDesc,&local_118," in ");
  deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
            (&local_c0,(DrawTestSpec *)&DAT_00000001,storage);
  std::operator+(&desc,&iterationDesc,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&iterationDesc);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&test);
  std::__cxx11::string::~string((string *)&local_f8);
  pDVar1 = (DrawTest *)operator_new(0x138);
  deqp::gls::DrawTest::DrawTest
            (pDVar1,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             ((this->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
             desc._M_dataplus._M_p);
  local_80.indexType = INDEXTYPE_SHORT;
  local_80.indexStorage = STORAGE_BUFFER;
  test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr =
       pDVar1;
  for (lVar2 = 0xc;
      (pDVar1 = test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                .m_data.ptr, lVar2 != 0x18 &&
      (*(int *)((long)tests[0].offsets + lVar2 + -0xc) != -1)); lVar2 = lVar2 + 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"offset ",(allocator<char> *)&local_c0);
    value = (int *)((long)tests[0].offsets + lVar2 + -0xc);
    de::toString<int>(&local_f8,value);
    std::operator+(&iterationDesc,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    local_80.indexPointerOffset = *value;
    deqp::gls::DrawTest::addIteration
              (test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
               m_data.ptr,&local_80,iterationDesc._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&iterationDesc);
  }
  test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.m_data.ptr =
       (DrawTest *)0x0;
  tcu::TestNode::addChild(local_180,(TestNode *)pDVar1);
  de::details::UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
  ~UniqueBase(&test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>)
  ;
  std::__cxx11::string::~string((string *)&desc);
  std::__cxx11::string::~string((string *)&name);
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_80.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* unalignedBufferGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_buffer", "unaligned buffer");

	genBasicSpec(spec, m_method);

	this->addChild(unalignedBufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];

		DE_ASSERT(indexTest.storage != gls::DrawTestSpec::STORAGE_USER);
		DE_ASSERT(!indexTest.aligned);
		tcu::TestCaseGroup*				group		= unalignedBufferGroup;

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
				  spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}